

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# covscript.cpp
# Opt level: O1

string * cs::get_import_path_abi_cxx11_(void)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *__s;
  long *plVar2;
  size_t sVar3;
  size_type *psVar4;
  long *plVar5;
  string *in_RDI;
  string base_path;
  string local_d0;
  long *local_b0;
  ulong local_a8;
  long local_a0;
  long lStack_98;
  long *local_90;
  ulong local_88;
  long local_80;
  long lStack_78;
  string local_70;
  long *local_50 [2];
  long local_40 [2];
  
  __s = getenv("CS_IMPORT_PATH");
  get_sdk_path_abi_cxx11_();
  plVar2 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_b0,local_a8,0,'\x01');
  paVar1 = &local_d0.field_2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_d0.field_2._M_allocated_capacity = *psVar4;
    local_d0.field_2._8_8_ = plVar2[3];
    local_d0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar4;
    local_d0._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_d0._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_d0);
  local_70._M_dataplus._M_p = (pointer)&local_70.field_2;
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_70.field_2._M_allocated_capacity = *psVar4;
    local_70.field_2._8_8_ = plVar2[3];
  }
  else {
    local_70.field_2._M_allocated_capacity = *psVar4;
    local_70._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_70._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  local_50[0] = local_40;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_50,"/usr/share/covscript","");
  plVar2 = (long *)std::__cxx11::string::insert((ulong)local_50,0,'\x01');
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_80 = *plVar5;
    lStack_78 = plVar2[3];
    local_90 = &local_80;
  }
  else {
    local_80 = *plVar5;
    local_90 = (long *)*plVar2;
  }
  local_88 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_90,local_88,0,'\x01');
  plVar5 = plVar2 + 2;
  if ((long *)*plVar2 == plVar5) {
    local_a0 = *plVar5;
    lStack_98 = plVar2[3];
    local_b0 = &local_a0;
  }
  else {
    local_a0 = *plVar5;
    local_b0 = (long *)*plVar2;
  }
  local_a8 = plVar2[1];
  *plVar2 = (long)plVar5;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  plVar2 = (long *)std::__cxx11::string::append((char *)&local_b0);
  psVar4 = (size_type *)(plVar2 + 2);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)*plVar2 ==
      (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)psVar4) {
    local_d0.field_2._M_allocated_capacity = *psVar4;
    local_d0.field_2._8_8_ = plVar2[3];
    local_d0._M_dataplus._M_p = (pointer)paVar1;
  }
  else {
    local_d0.field_2._M_allocated_capacity = *psVar4;
    local_d0._M_dataplus._M_p = (pointer)*plVar2;
  }
  local_d0._M_string_length = plVar2[1];
  *plVar2 = (long)psVar4;
  plVar2[1] = 0;
  *(undefined1 *)(plVar2 + 2) = 0;
  std::__cxx11::string::_M_append((char *)&local_70,(ulong)local_d0._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_d0._M_dataplus._M_p != paVar1) {
    operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
  }
  if (local_b0 != &local_a0) {
    operator_delete(local_b0,local_a0 + 1);
  }
  if (local_90 != &local_80) {
    operator_delete(local_90,local_80 + 1);
  }
  if (local_50[0] != local_40) {
    operator_delete(local_50[0],local_40[0] + 1);
  }
  if (__s == (char *)0x0) {
    process_path(in_RDI,&local_70);
  }
  else {
    local_90 = &local_80;
    sVar3 = strlen(__s);
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_90,__s,__s + sVar3);
    plVar2 = (long *)std::__cxx11::string::_M_replace_aux((ulong)&local_90,local_88,0,'\x01');
    plVar5 = plVar2 + 2;
    if ((long *)*plVar2 == plVar5) {
      local_a0 = *plVar5;
      lStack_98 = plVar2[3];
      local_b0 = &local_a0;
    }
    else {
      local_a0 = *plVar5;
      local_b0 = (long *)*plVar2;
    }
    local_a8 = plVar2[1];
    *plVar2 = (long)plVar5;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    plVar2 = (long *)std::__cxx11::string::_M_append
                               ((char *)&local_b0,(ulong)local_70._M_dataplus._M_p);
    psVar4 = (size_type *)(plVar2 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar2 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar4) {
      local_d0.field_2._M_allocated_capacity = *psVar4;
      local_d0.field_2._8_8_ = plVar2[3];
      local_d0._M_dataplus._M_p = (pointer)paVar1;
    }
    else {
      local_d0.field_2._M_allocated_capacity = *psVar4;
      local_d0._M_dataplus._M_p = (pointer)*plVar2;
    }
    local_d0._M_string_length = plVar2[1];
    *plVar2 = (long)psVar4;
    plVar2[1] = 0;
    *(undefined1 *)(plVar2 + 2) = 0;
    process_path(in_RDI,&local_d0);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_d0._M_dataplus._M_p != paVar1) {
      operator_delete(local_d0._M_dataplus._M_p,local_d0.field_2._M_allocated_capacity + 1);
    }
    if (local_b0 != &local_a0) {
      operator_delete(local_b0,local_a0 + 1);
    }
    if (local_90 != &local_80) {
      operator_delete(local_90,local_80 + 1);
    }
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return in_RDI;
}

Assistant:

std::string get_import_path()
	{
		const char *import_path = std::getenv("CS_IMPORT_PATH");
		std::string base_path = get_sdk_path() + cs::path_separator + "imports";
		base_path += cs::path_delimiter + std::string(COVSCRIPT_PLATFORM_HOME) + cs::path_separator + "imports";
		if (import_path != nullptr)
			return process_path(std::string(import_path) + cs::path_delimiter + base_path);
		else
			return process_path(base_path);
	}